

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffchdu(fitsfile *fptr,int *status)

{
  tcolumn *__ptr;
  FITSfile *pFVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  int stdriver;
  char message [81];
  int local_7c;
  char local_78 [88];
  
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if (fptr->Fptr->writemode == 1) {
      urltype2driver("stream://",&local_7c);
      if (fptr->Fptr->driver != local_7c) {
        ffrdef(fptr,status);
      }
      if (0 < fptr->Fptr->heapsize) {
        ffuptf(fptr,status);
      }
      ffpdfl(fptr,status);
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((fptr->Fptr->open_count == 1) && (__ptr = fptr->Fptr->tableptr, __ptr != (tcolumn *)0x0)) {
    free(__ptr);
    pFVar1 = fptr->Fptr;
    pFVar1->tableptr = (tcolumn *)0x0;
    if (pFVar1->tilerow != (int *)0x0) {
      uVar4 = (uint)((pFVar1->znaxis[0] + -1) / pFVar1->tilesize[0]);
      if (uVar4 < 0x7fffffff) {
        uVar3 = 0;
        do {
          pvVar2 = fptr->Fptr->tiledata[uVar3];
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
          pvVar2 = fptr->Fptr->tilenullarray[uVar3];
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
          uVar3 = uVar3 + 1;
        } while (uVar4 + 1 != uVar3);
      }
      free(fptr->Fptr->tileanynull);
      free(fptr->Fptr->tiletype);
      free(fptr->Fptr->tiledatasize);
      free(fptr->Fptr->tilenullarray);
      free(fptr->Fptr->tiledata);
      free(fptr->Fptr->tilerow);
      pFVar1 = fptr->Fptr;
      pFVar1->tilenullarray = (void **)0x0;
      pFVar1->tileanynull = (int *)0x0;
      pFVar1->tiletype = (int *)0x0;
      pFVar1->tiledata = (void **)0x0;
      pFVar1->tilerow = (int *)0x0;
      pFVar1->tiledatasize = (long *)0x0;
    }
  }
  if (*status != 999 && 0 < *status) {
    snprintf(local_78,0x51,"Error while closing HDU number %d (ffchdu).",
             (ulong)(uint)fptr->Fptr->curhdu);
    ffxmsg(5,local_78);
  }
  return *status;
}

Assistant:

int ffchdu(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
{
/*
  close the current HDU.  If we have write access to the file, then:
    - write the END keyword and pad header with blanks if necessary
    - check the data fill values, and rewrite them if not correct
*/
    char message[FLEN_ERRMSG];
    int ii, stdriver, ntilebins;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
        /* no need to do any further updating of the HDU */
    }
    else if ((fptr->Fptr)->writemode == 1)
    {
        urltype2driver("stream://", &stdriver);

        /* don't rescan header in special case of writing to stdout */
        if (((fptr->Fptr)->driver != stdriver)) 
             ffrdef(fptr, status); 

        if ((fptr->Fptr)->heapsize > 0) {
          ffuptf(fptr, status);  /* update the variable length TFORM values */
        }
	
        ffpdfl(fptr, status);  /* insure correct data fill values */
    }

    if ((fptr->Fptr)->open_count == 1)
    {

    /* free memory for the CHDU structure only if no other files are using it */
        if ((fptr->Fptr)->tableptr)
        {
            free((fptr->Fptr)->tableptr);
           (fptr->Fptr)->tableptr = NULL;

          /* free the tile-compressed image cache, if it exists */
          if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
          }
        }
    }

    if (*status > 0 && *status != NO_CLOSE_ERROR)
    {
        snprintf(message,FLEN_ERRMSG,
        "Error while closing HDU number %d (ffchdu).", (fptr->Fptr)->curhdu);
        ffpmsg(message);
    }
    return(*status);
}